

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::_InternalSerializeImpl
          (ExtensionSet *this,MessageLite *extendee,int start_field_number,int end_field_number,
          uint8_t *target,EpsCopyOutputStream *stream)

{
  KeyValue *pKVar1;
  KeyValue *pKVar2;
  uint8_t *puVar3;
  
  if ((short)this->flat_size_ < 0) {
    puVar3 = _InternalSerializeImplLarge
                       (this,extendee,start_field_number,end_field_number,target,stream);
    return puVar3;
  }
  pKVar1 = flat_end(this);
  for (pKVar2 = flat_begin(this); (pKVar2 != pKVar1 && (pKVar2->first < start_field_number));
      pKVar2 = pKVar2 + 1) {
  }
  for (; (pKVar2 != pKVar1 && (pKVar2->first < end_field_number)); pKVar2 = pKVar2 + 1) {
    target = Extension::InternalSerializeFieldWithCachedSizesToArray
                       (&pKVar2->second,extendee,this,pKVar2->first,target,stream);
  }
  return target;
}

Assistant:

uint8_t* ExtensionSet::_InternalSerializeImpl(
    const MessageLite* extendee, int start_field_number, int end_field_number,
    uint8_t* target, io::EpsCopyOutputStream* stream) const {
  if (ABSL_PREDICT_FALSE(is_large())) {
    return _InternalSerializeImplLarge(extendee, start_field_number,
                                       end_field_number, target, stream);
  }
  const KeyValue* end = flat_end();
  const KeyValue* it = flat_begin();
  while (it != end && it->first < start_field_number) ++it;
  for (; it != end && it->first < end_field_number; ++it) {
    target = it->second.InternalSerializeFieldWithCachedSizesToArray(
        extendee, this, it->first, target, stream);
  }
  return target;
}